

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O3

void __thiscall
FSSMainWindow::onCurrentChanged(FSSMainWindow *this,QModelIndex *current,QModelIndex *param_2)

{
  QAbstractItemModel *pQVar1;
  uint _t2;
  Resource _t1;
  int local_30;
  int local_2c;
  long local_20;
  
  pQVar1 = current->m;
  if (pQVar1 != (QAbstractItemModel *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_30,pQVar1,current);
    if (((-1 < local_30) && (-1 < local_2c)) && (local_20 != 0)) {
      pQVar1 = current->m;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        _t1 = AssetNone;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x68))(&local_30,pQVar1,current);
        _t1 = local_30 + AssetArtLandscape;
      }
      _t2 = current->r;
      goto LAB_00124a27;
    }
  }
  _t1 = AssetNone;
  _t2 = 0;
LAB_00124a27:
  resourceSelected(this,_t1,_t2);
  return;
}

Assistant:

void
FSSMainWindow::onCurrentChanged(const QModelIndex &current,
                                const QModelIndex & /*previous*/) {
  Data::Resource resource_class = Data::AssetNone;
  unsigned int index = 0;

  if (current.parent().isValid()) {
    resource_class = (Data::Resource)(current.parent().row() + 1);
    index = current.row();
  }

  emit resourceSelected(resource_class, index);
}